

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

PolymorphicInlineCacheIDL * __thiscall
Memory::AllocateArray<Memory::Recycler,PolymorphicInlineCacheIDL,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  PolymorphicInlineCacheIDL *pPVar3;
  Type *pTVar4;
  ulong uVar5;
  size_t byteSize;
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pPVar3 = (PolymorphicInlineCacheIDL *)0x8;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    pPVar3 = (PolymorphicInlineCacheIDL *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    auVar2 = _DAT_00e0c4f0;
    uVar5 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count * 0x18 - 0x18;
    auVar1 = auVar1 / ZEXT816(0x18);
    auVar6._8_4_ = auVar1._0_4_;
    auVar6._0_8_ = auVar1._0_8_;
    auVar6._12_4_ = auVar1._4_4_;
    pTVar4 = &pPVar3->addr;
    auVar7 = pmovsxbq(in_XMM1,0x100);
    auVar6 = auVar6 ^ _DAT_00e0c4f0;
    do {
      if ((bool)(~(auVar6._0_8_ < (long)(uVar5 ^ auVar2._0_8_)) & 1)) {
        pTVar4->ptr = (void *)0x0;
      }
      auVar8._8_4_ = (int)uVar5;
      auVar8._0_8_ = uVar5;
      auVar8._12_4_ = (int)(uVar5 >> 0x20);
      if ((long)((auVar8._8_8_ | auVar7._8_8_) ^ auVar2._8_8_) <= auVar6._8_8_) {
        pTVar4[3] = (void *)0x0;
      }
      uVar5 = uVar5 + 2;
      pTVar4 = pTVar4 + 6;
    } while ((auVar1._0_8_ + 2U & 0x1ffffffffffffffe) != uVar5);
  }
  return pPVar3;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}